

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ForVariableDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForVariableDeclarationSyntax,slang::parsing::Token,slang::syntax::DataTypeSyntax*,slang::syntax::DeclaratorSyntax&>
          (BumpAllocator *this,Token *args,DataTypeSyntax **args_1,DeclaratorSyntax *args_2)

{
  DataTypeSyntax *pDVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  ForVariableDeclarationSyntax *pFVar7;
  
  pFVar7 = (ForVariableDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForVariableDeclarationSyntax *)this->endPtr < pFVar7 + 1) {
    pFVar7 = (ForVariableDeclarationSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pFVar7 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pDVar1 = *args_1;
  (pFVar7->super_SyntaxNode).kind = ForVariableDeclaration;
  (pFVar7->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pFVar7->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pFVar7->varKeyword).kind = TVar3;
  (pFVar7->varKeyword).field_0x2 = uVar4;
  (pFVar7->varKeyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (pFVar7->varKeyword).rawLen = uVar6;
  (pFVar7->varKeyword).info = pIVar2;
  pFVar7->type = pDVar1;
  (pFVar7->declarator).ptr = args_2;
  if (pDVar1 != (DataTypeSyntax *)0x0) {
    (pDVar1->super_ExpressionSyntax).super_SyntaxNode.parent = &pFVar7->super_SyntaxNode;
  }
  (args_2->super_SyntaxNode).parent = &pFVar7->super_SyntaxNode;
  return pFVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }